

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_entity_zenobian.cxx
# Opt level: O2

void __thiscall xray_re::se_turret_mgun::se_turret_mgun(se_turret_mgun *this)

{
  cse_alife_helicopter::cse_alife_helicopter(&this->super_cse_alife_helicopter);
  (this->super_cse_alife_helicopter).super_cse_alife_dynamic_object_visual.
  super_cse_alife_dynamic_object.super_cse_alife_object.super_cse_abstract._vptr_cse_abstract =
       (_func_int **)&PTR__cse_alife_helicopter_0023d0d8;
  (this->super_cse_alife_helicopter).super_cse_alife_dynamic_object_visual.super_cse_visual.
  _vptr_cse_visual = (_func_int **)&PTR__se_turret_mgun_0023d140;
  (this->super_cse_alife_helicopter).super_cse_motion._vptr_cse_motion =
       (_func_int **)&PTR__se_turret_mgun_0023d168;
  (this->super_cse_alife_helicopter).super_cse_ph_skeleton._vptr_cse_ph_skeleton =
       (_func_int **)&PTR__se_turret_mgun_0023d190;
  this->m_health = 0.0;
  return;
}

Assistant:

se_turret_mgun::se_turret_mgun(): m_health(0) {}